

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rule_utils.cpp
# Opt level: O0

RuleBuilder * __thiscall Potassco::RuleBuilder::end(RuleBuilder *this,AbstractProgram *out)

{
  Weight_t WVar1;
  Weight_t *pWVar2;
  RuleBuilder *in_RSI;
  RuleBuilder *in_RDI;
  Rule *r;
  RuleBuilder *in_stack_ffffffffffffff40;
  RuleBuilder *in_stack_ffffffffffffff50;
  undefined1 local_90 [24];
  undefined1 local_78 [24];
  AtomSpan local_60;
  Head_t local_4c;
  LitSpan local_48;
  AtomSpan local_38;
  Head_t local_24;
  Rule *local_20;
  RuleBuilder *local_18;
  
  local_18 = in_RSI;
  local_20 = rule_((RuleBuilder *)0x2653b9);
  *(uint *)local_20 = *(uint *)local_20 & 0x7fffffff | 0x80000000;
  if (local_18 != (RuleBuilder *)0x0) {
    if ((*(uint *)&local_20->head >> 0x1e == 2) || (*(uint *)&local_20->body >> 0x1e != 0)) {
      if (*(uint *)&local_20->head >> 0x1e == 2) {
        pWVar2 = bound_(local_18);
        WVar1 = *pWVar2;
        sum(in_stack_ffffffffffffff50);
        (**(code **)((long)(local_18->mem_).beg_ + 0x30))(local_18,WVar1,local_90);
      }
      else {
        Head_t::Head_t(&local_4c,*(uint *)&local_20->head >> 0x1e);
        local_60 = head(in_stack_ffffffffffffff40);
        pWVar2 = bound_(in_stack_ffffffffffffff40);
        WVar1 = *pWVar2;
        sum(local_18);
        (**(code **)((long)(local_18->mem_).beg_ + 0x28))
                  (local_18,local_4c.val_,&local_60,WVar1,local_78);
      }
    }
    else {
      Head_t::Head_t(&local_24,*(uint *)&local_20->head >> 0x1e);
      local_38 = head(in_stack_ffffffffffffff40);
      local_48 = body(in_stack_ffffffffffffff40);
      (**(code **)((long)(local_18->mem_).beg_ + 0x20))(local_18,local_24.val_,&local_38,&local_48);
    }
  }
  return in_RDI;
}

Assistant:

RuleBuilder& RuleBuilder::end(AbstractProgram* out) {
	Rule* r = rule_();
	r->fix  = 1;
	if (!out) { return *this; }
	if (r->head.type != Directive_t::Minimize && r->body.type == Body_t::Normal) {
		out->rule(static_cast<Head_t>(r->head.type), head(), body());
	}
	else {
		if   (r->head.type != Directive_t::Minimize) { out->rule(static_cast<Head_t>(r->head.type), head(), *bound_(), sum().lits); }
		else                                         { out->minimize(*bound_(), sum().lits); }
	}
	return *this;
}